

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O3

_Bool trans_srli(DisasContext_conflict12 *ctx,arg_srli *a)

{
  int iVar1;
  TCGTemp *a1;
  uintptr_t o;
  TCGv_i64 pTVar2;
  uintptr_t o_1;
  TCGOpcode opc;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  iVar1 = a->shamt;
  if ((0x3f < iVar1) || (a->rd == 0)) goto LAB_00c6ce07;
  a1 = tcg_temp_new_internal_riscv64((TCGContext_conflict11 *)ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)ctx);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_00c6cdba:
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,opc,(TCGArg)a1,(TCGArg)pTVar2);
  }
  else {
    pTVar2 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rs1];
    if (pTVar2 != ret) {
      pTVar2 = pTVar2 + (long)ctx;
      opc = INDEX_op_mov_i64;
      goto LAB_00c6cdba;
    }
  }
  tcg_gen_shri_i64_riscv64((TCGContext_conflict11 *)ctx,ret,ret,(long)a->shamt);
  if (((long)a->rd != 0) && (pTVar2 = (TCGv_i64)(&ctx[0x158].base.pc_next)[a->rd], pTVar2 != ret)) {
    tcg_gen_op2_riscv64((TCGContext_conflict11 *)ctx,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)ctx),
                        (TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64((TCGContext_conflict11 *)ctx,(TCGTemp *)(ret + (long)ctx));
LAB_00c6ce07:
  return iVar1 < 0x40;
}

Assistant:

static bool trans_srli(DisasContext *ctx, arg_srli *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (a->shamt >= TARGET_LONG_BITS) {
        return false;
    }

    if (a->rd != 0) {
        TCGv t = tcg_temp_new(tcg_ctx);
        gen_get_gpr(tcg_ctx, t, a->rs1);

        tcg_gen_shri_tl(tcg_ctx, t, t, a->shamt);
        gen_set_gpr(tcg_ctx, a->rd, t);
        tcg_temp_free(tcg_ctx, t);
    } /* NOP otherwise */
    return true;
}